

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * anon_unknown.dwarf_90803::toolBarAreaStringFromDOMAttributes(DomPropertyMap *attributes)

{
  Kind KVar1;
  DomProperty *this;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  DomProperty *pstyle;
  QString result;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QLatin1String *a;
  QString *local_c8;
  QString local_30;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  local_18 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
  this = QHash<QString,_DomProperty_*>::value<QLatin1String,_true>
                   ((QHash<QString,_DomProperty_*> *)a,in_RDI);
  local_30.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_30.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_30.d.size = -0x5555555555555556;
  QString::QString((QString *)0x134efb);
  if (this == (DomProperty *)0x0) {
    QString::QString((QString *)in_RDI,
                     (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  else {
    KVar1 = DomProperty::kind(this);
    if (KVar1 == Enum) {
      DomProperty::elementEnum((DomProperty *)CONCAT44(6,in_stack_ffffffffffffff18));
      QString::operator=((QString *)in_RDI,(QString *)CONCAT44(KVar1,in_stack_ffffffffffffff18));
      QString::~QString((QString *)0x134fac);
    }
    else if (KVar1 == Number) {
      DomProperty::elementNumber(this);
      QVar2 = language::toolbarArea(0);
      local_c8 = (QString *)QVar2.m_size;
      QString::operator=(&local_30,(QLatin1String *)local_c8);
      local_c8 = (QString *)QVar2.m_data;
    }
    expandToolBarArea(local_c8);
    Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_RDI);
    ::operator+((QString *)a,in_RDI);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QLatin1String> *)CONCAT44(KVar1,in_stack_ffffffffffffff18));
    QStringBuilder<QString,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1String> *)0x13500a);
    QString::~QString((QString *)0x135014);
  }
  QString::~QString((QString *)0x135029);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)a;
}

Assistant:

QString toolBarAreaStringFromDOMAttributes(const CPP::WriteInitialization::DomPropertyMap &attributes) {
        const DomProperty *pstyle = attributes.value("toolBarArea"_L1);
        QString result;
        if (!pstyle)
            return result;
        switch (pstyle->kind()) {
        case DomProperty::Number:
            result = language::toolbarArea(pstyle->elementNumber());
            break;
        case DomProperty::Enum:
            result = pstyle->elementEnum();
            break;
        default:
            break;
        }
        return expandToolBarArea(result) + ", "_L1;
    }